

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]> *this)

{
  QChar *__dest;
  long lVar1;
  char16_t *__dest_00;
  CutResult CVar2;
  char16_t *pcVar3;
  char16_t *__src;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QChar *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->a).a.d.size + 10 + (long)(this->a).b.m_length;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1,Uninitialized);
  __dest_00 = (__return_storage_ptr__->d).ptr;
  lVar4 = (this->a).a.d.size;
  if (lVar4 != 0) {
    pcVar3 = (this->a).a.d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest_00,pcVar3,lVar4 * 2);
  }
  __dest = (QChar *)(__dest_00 + lVar4);
  lVar4 = (long)(this->a).b.m_length;
  local_50 = __dest;
  if (lVar4 != 0) {
    pcVar3 = (this->a).b.m_string.d.ptr;
    local_40 = (long)(this->a).b.m_offset;
    local_48 = lVar4;
    CVar2 = QtPrivate::QContainerImplHelper::mid((this->a).b.m_string.d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar2 != Null) {
      __src = pcVar3 + local_40;
    }
    memcpy(__dest,__src,lVar4 * 2);
    local_50 = __dest + lVar4;
  }
  QVar5.m_data = *this->b;
  QVar5.m_size = 10;
  QAbstractConcatenable::convertFromUtf8(QVar5,&local_50);
  if (lVar1 != (long)local_50 - (long)__dest_00 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }